

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::TextFilesDiffer(string *path1,string *path2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string line2;
  string line1;
  ifstream if2;
  byte abStack_420 [488];
  ifstream if1;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&if1,(path1->_M_dataplus)._M_p,_S_in);
  std::ifstream::ifstream(&if2,(path2->_M_dataplus)._M_p,_S_in);
  bVar3 = true;
  if (((abStack_218[*(long *)(_if1 + -0x18)] & 5) == 0) &&
     ((abStack_420[*(long *)(_if2 + -0x18)] & 5) == 0)) {
    do {
      line1._M_dataplus._M_p = (pointer)&line1.field_2;
      line1._M_string_length = 0;
      line1.field_2._M_local_buf[0] = '\0';
      line2._M_dataplus._M_p = (pointer)&line2.field_2;
      line2._M_string_length = 0;
      line2.field_2._M_local_buf[0] = '\0';
      bVar1 = GetLineFromStream((istream *)&if1,&line1,(bool *)0x0,-1);
      bVar2 = GetLineFromStream((istream *)&if2,&line2,(bool *)0x0,-1);
      if (bVar1 && bVar2) {
        bVar1 = std::operator!=(&line1,&line2);
        iVar4 = 0;
        if (bVar1) {
          std::__cxx11::string::~string((string *)&line2);
          std::__cxx11::string::~string((string *)&line1);
          goto LAB_00332558;
        }
      }
      else {
        iVar4 = 2 - (uint)(bVar1 != bVar2);
      }
      std::__cxx11::string::~string((string *)&line2);
      std::__cxx11::string::~string((string *)&line1);
    } while (iVar4 == 0);
    if (iVar4 == 2) {
      bVar3 = false;
    }
  }
LAB_00332558:
  std::ifstream::~ifstream(&if2);
  std::ifstream::~ifstream(&if1);
  return bVar3;
}

Assistant:

bool SystemTools::TextFilesDiffer(const std::string& path1,
                                  const std::string& path2)
{
  kwsys::ifstream if1(path1.c_str());
  kwsys::ifstream if2(path2.c_str());
  if (!if1 || !if2) {
    return true;
  }

  for (;;) {
    std::string line1, line2;
    bool hasData1 = GetLineFromStream(if1, line1);
    bool hasData2 = GetLineFromStream(if2, line2);
    if (hasData1 != hasData2) {
      return true;
    }
    if (!hasData1) {
      break;
    }
    if (line1 != line2) {
      return true;
    }
  }
  return false;
}